

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine.cpp
# Opt level: O0

bool __thiscall
QNativeSocketEngine::setMulticastInterface(QNativeSocketEngine *this,QNetworkInterface *iface)

{
  QNativeSocketEnginePrivate *file;
  ulong uVar1;
  QMessageLogger *in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QNativeSocketEnginePrivate *d;
  undefined7 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8f;
  int line;
  bool local_49;
  char local_48 [8];
  QNetworkInterface *in_stack_ffffffffffffffc0;
  QNativeSocketEnginePrivate *in_stack_ffffffffffffffc8;
  char local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = d_func((QNativeSocketEngine *)0x25fdbf);
  uVar1 = (**(code **)(*in_RDI + 0x78))();
  line = (int)((ulong)in_RDI >> 0x20);
  if ((uVar1 & 1) == 0) {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)file,line,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    QMessageLogger::warning
              (local_28,
               "QNativeSocketEngine::setMulticastInterface() was called on an uninitialized socket device"
              );
    local_49 = false;
  }
  else if ((file->super_QAbstractSocketEnginePrivate).socketType == UdpSocket) {
    local_49 = QNativeSocketEnginePrivate::nativeSetMulticastInterface
                         (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  }
  else {
    QMessageLogger::QMessageLogger
              (in_RSI,(char *)file,line,
               (char *)CONCAT17(in_stack_ffffffffffffff8f,in_stack_ffffffffffffff88));
    QMessageLogger::warning
              (local_48,
               "QNativeSocketEngine::setMulticastInterface() was called by a socket other than QAbstractSocket::UdpSocket"
              );
    local_49 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_49;
  }
  __stack_chk_fail();
}

Assistant:

bool QNativeSocketEngine::setMulticastInterface(const QNetworkInterface &iface)
{
    Q_D(QNativeSocketEngine);
    Q_CHECK_VALID_SOCKETLAYER(QNativeSocketEngine::setMulticastInterface(), false);
    Q_CHECK_TYPE(QNativeSocketEngine::setMulticastInterface(), QAbstractSocket::UdpSocket, false);
    return d->nativeSetMulticastInterface(iface);
}